

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O0

gravity_callframe_t * gravity_new_callframe(gravity_vm *vm,gravity_fiber_t *fiber)

{
  uint uVar1;
  gravity_callframe_t *pgVar2;
  void *ptr;
  uint32_t new_size;
  gravity_fiber_t *fiber_local;
  gravity_vm *vm_local;
  
  if (fiber->framesalloc == fiber->nframes) {
    uVar1 = fiber->framesalloc << 1;
    pgVar2 = (gravity_callframe_t *)
             gravity_realloc((gravity_vm *)0x0,fiber->frames,(ulong)uVar1 * 0x30);
    if (pgVar2 == (gravity_callframe_t *)0x0) {
      report_runtime_error
                (vm,GRAVITY_ERROR_RUNTIME,
                 "Infinite loop detected. Current execution must be aborted.");
      return (gravity_callframe_t *)0x0;
    }
    fiber->frames = pgVar2;
    fiber->framesalloc = uVar1;
  }
  fiber->nframes = fiber->nframes + 1;
  return fiber->frames + (fiber->nframes - 1);
}

Assistant:

static inline gravity_callframe_t *gravity_new_callframe (gravity_vm *vm, gravity_fiber_t *fiber) {
    #pragma unused(vm)

    // check if there are enough slots in the call frame and optionally create new cframes
    if (fiber->framesalloc - fiber->nframes < 1) {
        uint32_t new_size = fiber->framesalloc * 2;
        void *ptr = mem_realloc(NULL, fiber->frames, sizeof(gravity_callframe_t) * new_size);
        if (!ptr) {
            // frames reallocation failed means that there is a very high probability to be into an infinite loop
            report_runtime_error(vm, GRAVITY_ERROR_RUNTIME, "Infinite loop detected. Current execution must be aborted.");
            return NULL;
        }
        fiber->frames = (gravity_callframe_t *)ptr;
        fiber->framesalloc = new_size;
        STAT_FRAMES_REALLOCATED(vm);
    }

    // update frames counter
    ++fiber->nframes;

    // return first available cframe (-1 because I just updated the frames counter)
    return &fiber->frames[fiber->nframes - 1];
}